

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::determine_victims
          (PatternAddressMapper *this,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns)

{
  size_t bk;
  size_t sVar1;
  uint uVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  int delta_nrows;
  int iVar6;
  pointer __k;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 local_a0 [8];
  DRAMAddr victim_start;
  string local_80;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  pointer local_40;
  allocator<char> local_31;
  
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)this);
  local_50 = (agg_access_patterns->
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_40 = (agg_access_patterns->
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(this->aggressor_to_addr)._M_h;
  local_48 = this_00;
  do {
    if (local_50 == local_40) {
      return;
    }
    local_58 = (local_50->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    __k = (local_50->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
          super__Vector_impl_data._M_start;
    while (__k != local_58) {
      sVar3 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(this_00,&__k->id);
      if (sVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Could not find DRAMAddr mapping for Aggressor %d",&local_31)
        ;
        format_string<int>((string *)local_a0,&local_80,__k->id);
        Logger::log_error((string *)local_a0,true);
        std::__cxx11::string::~string((string *)local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        exit(1);
      }
      local_60 = __k;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,&__k->id);
      bk = pmVar4->bank;
      sVar1 = pmVar4->row;
      for (iVar6 = -5; iVar6 != 6; iVar6 = iVar6 + 1) {
        if ((iVar6 != 0) && (uVar2 = (int)sVar1 + iVar6, -1 < (int)uVar2)) {
          DRAMAddr::DRAMAddr((DRAMAddr *)local_a0,bk,(ulong)uVar2,0);
          local_80._M_dataplus._M_p = (pointer)DRAMAddr::to_virt((DRAMAddr *)local_a0);
          sVar5 = std::
                  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)this,(key_type *)&local_80);
          if (sVar5 == 0) {
            local_80._M_dataplus._M_p = (pointer)DRAMAddr::to_virt((DRAMAddr *)local_a0);
            std::__detail::
            _Insert<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)this,(value_type *)&local_80);
          }
        }
      }
      this_00 = local_48;
      __k = local_60 + 1;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void PatternAddressMapper::determine_victims(const std::vector<AggressorAccessPattern> &agg_access_patterns) {
  // check ROW_THRESHOLD rows around the aggressors for flipped bits
  const int ROW_THRESHOLD = 5;
  // a set to make sure we add victims only once
  victim_rows.clear();
  for (auto &acc_pattern : agg_access_patterns) {
    for (auto &agg : acc_pattern.aggressors) {

      if (aggressor_to_addr.count(agg.id)==0) {
        Logger::log_error(format_string("Could not find DRAMAddr mapping for Aggressor %d", agg.id));
        exit(EXIT_FAILURE);
      }

      const auto dram_addr = aggressor_to_addr.at(agg.id);

      for (int delta_nrows = -ROW_THRESHOLD; delta_nrows <= ROW_THRESHOLD; ++delta_nrows) {
        auto cur_row_candidate = static_cast<int>(dram_addr.row) + delta_nrows;

        // don't add the aggressor itself and ignore any non-existing (negative) row no.
        if (delta_nrows == 0 || cur_row_candidate < 0)
          continue;

        // ignore this victim if we already added it before
        auto victim_start = DRAMAddr(dram_addr.bank, static_cast<size_t>(cur_row_candidate), 0);
        if (victim_rows.count(static_cast<volatile char *>(victim_start.to_virt())) > 0)
          continue;

        victim_rows.insert(static_cast<volatile char *>(victim_start.to_virt()));
      }
    }
  }
}